

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O3

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  int iVar19;
  float *pfVar20;
  int iVar21;
  uint uVar22;
  float *pfVar23;
  long lVar24;
  float *pfVar25;
  float *pfVar26;
  float fVar27;
  
  iVar9 = bottom_blob->c;
  if (0 < (long)iVar9) {
    iVar10 = top_blob->w;
    iVar11 = top_blob->h;
    iVar12 = bottom_blob->w;
    iVar19 = (iVar12 - iVar10) * 2;
    pvVar13 = top_blob->data;
    sVar14 = top_blob->cstep;
    sVar15 = top_blob->elemsize;
    pvVar16 = bottom_blob->data;
    sVar17 = bottom_blob->cstep;
    sVar18 = bottom_blob->elemsize;
    lVar24 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar27 = 0.0;
      }
      else {
        fVar27 = *(float *)((long)&_bias->data + lVar24 * 4);
      }
      if (0 < iVar11) {
        pfVar20 = (float *)(sVar14 * sVar15 * lVar24 + (long)pvVar13);
        pfVar23 = (float *)(sVar17 * sVar18 * lVar24 + (long)pvVar16);
        pfVar25 = pfVar23 + (long)iVar12 * 2;
        pfVar26 = pfVar23 + iVar12;
        iVar21 = 0;
        do {
          uVar22 = iVar10 + 1;
          if (0 < iVar10) {
            do {
              pfVar4 = pfVar23 + 1;
              fVar6 = *pfVar23;
              pfVar23 = pfVar23 + 2;
              fVar7 = *pfVar26;
              pfVar1 = pfVar26 + 1;
              pfVar26 = pfVar26 + 2;
              pfVar3 = (float *)((long)&_kernel->data + lVar24 * 0x24);
              pfVar5 = (float *)((long)&_kernel->elemsize + lVar24 * 0x24);
              uVar8 = *(undefined8 *)pfVar25;
              pfVar2 = pfVar25 + 2;
              pfVar25 = pfVar25 + 2;
              *pfVar20 = (float)((ulong)uVar8 >> 0x20) * pfVar5[3] + fVar7 * pfVar3[3] +
                         (float)((ulong)*(undefined8 *)pfVar1 >> 0x20) * pfVar5[1] +
                         (float)*(undefined8 *)pfVar4 * pfVar3[1] +
                         (float)uVar8 * pfVar5[2] +
                         (float)((ulong)*(undefined8 *)pfVar4 >> 0x20) * pfVar3[2] +
                         (float)*(undefined8 *)pfVar1 * *pfVar5 + fVar6 * *pfVar3 +
                         (float)(&_kernel->h)[lVar24 * 9] * *pfVar2 + fVar27;
              pfVar20 = pfVar20 + 1;
              uVar22 = uVar22 - 1;
            } while (1 < uVar22);
          }
          pfVar23 = pfVar23 + iVar19;
          pfVar26 = pfVar26 + iVar19;
          pfVar25 = pfVar25 + iVar19;
          iVar21 = iVar21 + 1;
        } while (iVar21 != iVar11);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != iVar9);
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for
    for (int g=0; g<group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g*9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w*2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }

    }
}